

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_3D_C.cpp
# Opt level: O1

void amrex::EB2::build_cells
               (Box *bx,Array4<amrex::EBCellFlag> *cell,Array4<unsigned_int> *fx,
               Array4<unsigned_int> *fy,Array4<unsigned_int> *fz,Array4<double> *apx,
               Array4<double> *apy,Array4<double> *apz,Array4<const_double> *fcx,
               Array4<const_double> *fcy,Array4<const_double> *fcz,Array4<const_double> *m2x,
               Array4<const_double> *m2y,Array4<const_double> *m2z,Array4<double> *vfrac,
               Array4<double> *vcent,Array4<double> *barea,Array4<double> *bcent,
               Array4<double> *bnorm,Array4<amrex::EBCellFlag> *ctmp,Array4<double> *levset,
               Real small_volfrac,Geometry *geom,bool extend_domain_face,bool cover_multiple_cuts,
               int *nsmallcells,int *nmulticuts)

{
  undefined1 *puVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  double *pdVar13;
  double *pdVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  int idim;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  EBCellFlag *pEVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  EBCellFlag *pEVar43;
  uint uVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  double *pdVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  short sVar52;
  long lVar53;
  ulong uVar54;
  int iVar55;
  int iVar56;
  long lVar57;
  long lVar58;
  double *pdVar59;
  long lVar60;
  double dVar61;
  uint uVar62;
  long lVar63;
  uint uVar64;
  uint *puVar65;
  long lVar66;
  int iVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  bool bVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  EBCellFlag *pEVar81;
  double dVar82;
  uint *puVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  Box result;
  Box gdomain;
  long local_3f0;
  undefined1 *local_3b8;
  undefined8 local_318;
  uint uStack_310;
  uint auStack_30c [2];
  undefined8 local_304;
  double *local_2f8;
  double *pdStack_2f0;
  double local_2e0;
  Array4<double> *local_2d8;
  uint local_2d0;
  int local_2cc;
  double local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  double local_2a8;
  Array4<double> *local_2a0;
  uint *local_298;
  undefined8 uStack_290;
  double local_288;
  undefined8 uStack_280;
  uint *local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  uint uStack_260;
  uint auStack_25c [2];
  undefined8 uStack_254;
  ulong local_240;
  Array4<amrex::EBCellFlag> *local_238;
  uint local_22c;
  uint *local_228;
  undefined8 uStack_220;
  uint *local_210;
  double local_208;
  undefined8 uStack_200;
  uint *local_1f8;
  undefined8 uStack_1f0;
  uint *local_1e8;
  undefined8 uStack_1e0;
  Array4<const_double> *local_1d0;
  Array4<const_double> *local_1c8;
  int *local_1c0;
  int local_1b4;
  uint local_1b0;
  int local_1ac;
  double local_1a8;
  undefined8 uStack_1a0;
  EBCellFlag *local_198;
  undefined8 uStack_190;
  double local_188;
  double dStack_180;
  EBCellFlag *local_178;
  undefined8 uStack_170;
  Array4<unsigned_int> *local_160;
  double local_158;
  undefined8 uStack_150;
  EBCellFlag *local_148;
  undefined8 uStack_140;
  ulong local_138;
  undefined1 *local_130;
  Array4<unsigned_int> *local_128;
  Array4<unsigned_int> *local_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  Geometry *local_e0;
  Box *local_d8;
  int *local_d0;
  int *local_c8;
  Array4<double> *local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  Array4<const_double> *local_98;
  Array4<const_double> *local_90;
  Array4<const_double> *local_88;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_d0 = nmulticuts;
  local_c8 = nsmallcells;
  local_e0 = geom;
  local_c0 = levset;
  local_238 = ctmp;
  local_88 = m2z;
  local_90 = m2y;
  local_98 = m2x;
  local_1c8 = fcy;
  local_1d0 = fcx;
  local_210 = (uint *)small_volfrac;
  local_160 = fy;
  local_128 = fx;
  local_120 = fz;
  local_1c0 = (int *)malloc(8);
  local_1c0[0] = 0;
  local_1c0[1] = 0;
  uVar16 = *(undefined8 *)(bx->smallend).vect;
  local_138 = *(ulong *)((bx->smallend).vect + 2);
  uVar17 = *(undefined8 *)(bx->bigend).vect;
  uVar54 = *(ulong *)((bx->bigend).vect + 2);
  uStack_310 = (uint)local_138;
  auStack_30c[0] = (uint)uVar17;
  uVar12 = auStack_30c[0];
  auStack_30c[1] = (uint)((ulong)uVar17 >> 0x20);
  local_318._0_4_ = (int)uVar16;
  iVar21 = (int)local_318;
  local_318._4_4_ = (uint)((ulong)uVar16 >> 0x20);
  local_b0 = (ulong)local_318._4_4_;
  local_2cc = (int)local_318 + -1;
  local_2d0 = local_318._4_4_ - 1;
  local_318 = CONCAT44(local_2d0,local_2cc);
  local_138 = local_138 & 0xffffffff;
  uStack_310 = uStack_310 - 1;
  local_240 = (ulong)uStack_310;
  local_1b0 = auStack_30c[0] + 1;
  auStack_30c[0] = local_1b0;
  local_a0 = (ulong)auStack_30c[1];
  local_304._0_4_ = (uint)uVar54;
  local_a8 = uVar54 & 0xffffffff;
  local_22c = auStack_30c[1] + 1;
  auStack_30c[1] = local_22c;
  local_1b4 = (uint)local_304 + 1;
  local_304._4_4_ = (uint)(uVar54 >> 0x20);
  local_304 = CONCAT44(local_304._4_4_,local_1b4);
  local_2d8 = vcent;
  local_2a0 = bnorm;
  local_d8 = bx;
  if ((int)uStack_310 <= local_1b4) {
    lVar66 = (long)(int)uStack_310;
    local_b8 = (long)(int)local_2d0;
    lVar27 = (long)local_2cc;
    lVar28 = lVar27 * 8;
    do {
      iVar55 = (int)lVar66;
      if ((int)local_2d0 <= (int)local_22c) {
        lVar29 = (long)(int)local_138;
        local_1ac = (int)local_b0;
        local_3f0 = local_b8;
        do {
          iVar25 = (int)local_3f0;
          if (local_2cc <= (int)local_1b0) {
            lVar30 = (long)local_1ac;
            lVar68 = 0;
            do {
              uVar19 = cell->p[((lVar66 - (cell->begin).z) * cell->kstride +
                               (local_3f0 - (cell->begin).y) * cell->jstride + lVar27 + lVar68) -
                               (long)(cell->begin).x].flag & 3;
              if (uVar19 == 3) {
                bVar18 = false;
                vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                         (local_3f0 - (vfrac->begin).y) * vfrac->jstride + lVar27 + lVar68) -
                         (long)(vfrac->begin).x] = 0.0;
                vcent->p[((lVar66 - (vcent->begin).z) * vcent->kstride +
                         (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                         (long)(vcent->begin).x] = 0.0;
                vcent->p[(vcent->nstride +
                         (lVar66 - (vcent->begin).z) * vcent->kstride +
                         (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                         (long)(vcent->begin).x] = 0.0;
                vcent->p[(vcent->nstride * 2 +
                         (lVar66 - (vcent->begin).z) * vcent->kstride +
                         (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                         (long)(vcent->begin).x] = 0.0;
                bcent->p[((lVar66 - (bcent->begin).z) * bcent->kstride +
                         (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                         (long)(bcent->begin).x] = -1.0;
                bcent->p[(bcent->nstride +
                         (lVar66 - (bcent->begin).z) * bcent->kstride +
                         (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                         (long)(bcent->begin).x] = -1.0;
                bcent->p[(bcent->nstride * 2 +
                         (lVar66 - (bcent->begin).z) * bcent->kstride +
                         (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                         (long)(bcent->begin).x] = -1.0;
                bnorm->p[((lVar66 - (bnorm->begin).z) * bnorm->kstride +
                         (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                         (long)(bnorm->begin).x] = 0.0;
                bnorm->p[(bnorm->nstride +
                         (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                         (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                         (long)(bnorm->begin).x] = 0.0;
                bnorm->p[(bnorm->nstride * 2 +
                         (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                         (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                         (long)(bnorm->begin).x] = 0.0;
                barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                         (local_3f0 - (barea->begin).y) * barea->jstride + lVar27 + lVar68) -
                         (long)(barea->begin).x] = 0.0;
                bVar72 = false;
              }
              else {
                if (uVar19 == 0) {
                  vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                           (local_3f0 - (vfrac->begin).y) * vfrac->jstride + lVar27 + lVar68) -
                           (long)(vfrac->begin).x] = 1.0;
                  bVar18 = false;
                  vcent->p[((lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  vcent->p[(vcent->nstride +
                           (lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  vcent->p[(vcent->nstride * 2 +
                           (lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  bcent->p[((lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bcent->p[(bcent->nstride +
                           (lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bcent->p[(bcent->nstride * 2 +
                           (lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bnorm->p[((lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  bnorm->p[(bnorm->nstride +
                           (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  bnorm->p[(bnorm->nstride * 2 +
                           (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                           (local_3f0 - (barea->begin).y) * barea->jstride + lVar27 + lVar68) -
                           (long)(barea->begin).x] = 0.0;
                }
                else {
                  iVar22 = (apx->begin).x;
                  lVar71 = (long)(apx->begin).y;
                  lVar42 = (long)iVar25;
                  lVar63 = (long)(apx->begin).z;
                  lVar38 = (long)iVar55;
                  iVar40 = (int)lVar68;
                  dVar61 = apx->p[lVar27 + (((lVar66 - lVar63) * apx->kstride +
                                            (local_3f0 - lVar71) * apx->jstride + lVar68) -
                                           (long)iVar22)];
                  dVar75 = apx->p[(lVar42 - lVar71) * apx->jstride +
                                  (long)((iVar40 + iVar21) - iVar22) +
                                  (lVar38 - lVar63) * apx->kstride];
                  lVar71 = (long)(apy->begin).x;
                  lVar63 = (long)(apy->begin).y;
                  lVar31 = (lVar66 - (apy->begin).z) * apy->kstride;
                  lVar37 = apy->jstride * 8;
                  puVar83 = *(uint **)((long)apy->p +
                                      lVar68 * 8 +
                                      (local_3f0 - lVar63) * lVar37 + lVar31 * 8 + lVar71 * -8 +
                                      lVar28);
                  puVar65 = *(uint **)((long)apy->p +
                                      lVar68 * 8 +
                                      (lVar30 - lVar63) * lVar37 + lVar31 * 8 + lVar71 * -8 + lVar28
                                      );
                  lVar71 = (long)(apz->begin).x;
                  lVar63 = (long)(apz->begin).z;
                  lVar37 = apz->kstride * 8;
                  lVar31 = (local_3f0 - (apz->begin).y) * apz->jstride;
                  dVar3 = *(double *)
                           ((long)apz->p +
                           lVar68 * 8 +
                           (lVar66 - lVar63) * lVar37 + lVar31 * 8 + lVar71 * -8 + lVar28);
                  dVar79 = *(double *)
                            ((long)apz->p +
                            lVar68 * 8 +
                            (lVar29 - lVar63) * lVar37 + lVar31 * 8 + lVar71 * -8 + lVar28);
                  if ((((dVar61 < 0.5) || (1.0 <= dVar61)) || (dVar75 < 0.5)) ||
                     ((((1.0 <= dVar75 || ((double)puVar83 < 0.5)) ||
                       ((1.0 <= (double)puVar83 ||
                        (((double)puVar65 < 0.5 || (1.0 <= (double)puVar65)))))) ||
                      ((dVar3 < 0.5 || (((1.0 <= dVar3 || (dVar79 < 0.5)) || (1.0 <= dVar79))))))))
                  {
                    local_288 = dVar61 - dVar75;
                    local_2f8 = (double *)((double)puVar83 - (double)puVar65);
                    local_228 = (uint *)(dVar3 - dVar79);
                    uStack_280 = 0;
                    dVar80 = (double)local_228 * (double)local_228 +
                             local_288 * local_288 + (double)local_2f8 * (double)local_2f8;
                    uStack_270 = 0;
                    uStack_1f0 = 0;
                    local_2b8._8_8_ = 0;
                    local_2b8._0_8_ = dVar3;
                    uStack_2c0 = 0;
                    uStack_220 = 0;
                    local_2c8 = dVar61;
                    local_278 = puVar65;
                    local_1f8 = puVar83;
                    if (dVar80 < 0.0) {
                      dVar80 = sqrt(dVar80);
                    }
                    else {
                      dVar80 = SQRT(dVar80);
                    }
                    if ((dVar80 == 0.0) && (!NAN(dVar80))) {
                      Assert_host("apnorm != 0.0_rt",
                                  "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_3D_C.cpp"
                                  ,0x44,"\"amrex::EB2:build_cells: apnorm==0\"");
                    }
                    dVar80 = 1.0 / dVar80;
                    puVar83 = (uint *)(local_288 * dVar80);
                    pEVar81 = (EBCellFlag *)((double)local_2f8 * dVar80);
                    dVar80 = dVar80 * (double)local_228;
                    bnorm->p[((lVar66 - (bnorm->begin).z) * bnorm->kstride +
                             (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                             (long)(bnorm->begin).x] = (double)puVar83;
                    bnorm->p[(bnorm->nstride +
                             (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                             (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                             (long)(bnorm->begin).x] = (double)pEVar81;
                    bnorm->p[(bnorm->nstride * 2 +
                             (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                             (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                             (long)(bnorm->begin).x] = dVar80;
                    barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                             (local_3f0 - (barea->begin).y) * barea->jstride + lVar27 + lVar68) -
                             (long)(barea->begin).x] =
                         (double)local_228 * dVar80 +
                         local_288 * (double)puVar83 + (double)local_2f8 * (double)pEVar81;
                    lVar32 = (long)(local_1c8->begin).x;
                    lVar63 = (long)(local_1c8->begin).y;
                    lVar31 = (lVar66 - (local_1c8->begin).z) * local_1c8->kstride;
                    lVar37 = local_1c8->jstride * 8;
                    lVar71 = (local_3f0 - lVar63) * lVar37 + lVar31 * 8;
                    local_288 = (double)(lVar32 * 8);
                    local_2f8 = local_1c8->p + lVar27;
                    local_228 = (uint *)((lVar30 - lVar63) * lVar37 + lVar31 * 8);
                    lVar33 = (long)(fcz->begin).x;
                    lVar37 = (long)(fcz->begin).z;
                    lVar31 = fcz->kstride * 8;
                    lVar35 = (local_3f0 - (fcz->begin).y) * fcz->jstride;
                    lVar63 = (lVar66 - lVar37) * lVar31 + lVar35 * 8;
                    pdVar13 = fcz->p;
                    lVar37 = (lVar29 - lVar37) * lVar31 + lVar35 * 8;
                    iVar22 = (local_1d0->begin).x;
                    lVar35 = (long)(local_1d0->begin).y;
                    lVar46 = (long)(local_1d0->begin).z;
                    lVar31 = (lVar66 - lVar46) * local_1d0->kstride;
                    lVar47 = (local_3f0 - lVar35) * local_1d0->jstride;
                    pdVar14 = local_1d0->p;
                    dVar76 = (dVar75 + local_2c8) * 0.5;
                    dVar77 = (dVar79 + (double)local_2b8._0_8_) * 0.5;
                    dVar3 = (*(double *)((long)pdVar13 + lVar68 * 8 + lVar63 + lVar33 * -8 + lVar28)
                             * (double)local_2b8._0_8_ -
                            *(double *)((long)pdVar13 + lVar68 * 8 + lVar37 + lVar33 * -8 + lVar28)
                            * dVar79) * dVar80 +
                            ((*(double *)((long)local_2f8 + lVar68 * 8 + lVar71 + lVar32 * -8) *
                              (double)local_1f8 -
                             *(double *)
                              ((long)(local_228 + lVar32 * -2) + (long)local_2f8 + lVar68 * 8) *
                             (double)local_278) * (double)pEVar81 - dVar76 * (double)puVar83);
                    dVar61 = ((double)local_1f8 + (double)local_278) * 0.5;
                    dVar73 = (*(double *)
                               ((long)pdVar13 +
                               lVar68 * 8 + lVar63 + fcz->nstride * 8 + lVar33 * -8 + lVar28) *
                              (double)local_2b8._0_8_ -
                             *(double *)
                              ((long)pdVar13 +
                              lVar68 * 8 + lVar37 + fcz->nstride * 8 + lVar33 * -8 + lVar28) *
                             dVar79) * dVar80 +
                             ((pdVar14[lVar27 + ((lVar47 + lVar31 + lVar68) - (long)iVar22)] *
                               local_2c8 -
                              pdVar14[(lVar42 - lVar35) * local_1d0->jstride +
                                      (long)((iVar21 + iVar40) - iVar22) +
                                      (lVar38 - lVar46) * local_1d0->kstride] * dVar75) *
                              (double)puVar83 - dVar61 * (double)pEVar81);
                    dVar74 = (*(double *)
                               ((long)local_2f8 +
                               lVar68 * 8 + lVar71 + local_1c8->nstride * 8 + lVar32 * -8) *
                              (double)local_1f8 -
                             *(double *)
                              ((long)(local_228 + local_1c8->nstride * 2 + lVar32 * -2) +
                               (long)local_2f8 + lVar68 * 8) * (double)local_278) * (double)pEVar81
                             + ((pdVar14[lVar27 + ((local_1d0->nstride + lVar47 + lVar31 + lVar68) -
                                                  (long)iVar22)] * local_2c8 -
                                (pdVar14 +
                                (lVar42 - lVar35) * local_1d0->jstride +
                                (long)((iVar21 + iVar40) - iVar22) +
                                (lVar38 - lVar46) * local_1d0->kstride)[local_1d0->nstride] * dVar75
                                ) * (double)puVar83 - dVar77 * dVar80);
                    vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                             (local_3f0 - (vfrac->begin).y) * vfrac->jstride + lVar27 + lVar68) -
                             (long)(vfrac->begin).x] =
                         (dVar80 * dVar74 +
                         (double)pEVar81 * dVar73 +
                         (double)puVar83 * dVar3 + dVar76 + dVar61 + dVar77) * 0.5;
                    lVar37 = (lVar66 - (vfrac->begin).z) * vfrac->kstride;
                    lVar63 = (local_3f0 - (vfrac->begin).y) * vfrac->jstride;
                    lVar71 = (long)(vfrac->begin).x;
                    dVar61 = vfrac->p[(lVar37 + lVar63 + lVar27 + lVar68) - lVar71];
                    if ((double)local_210 <= dVar61) {
                      dVar76 = 1.0 / barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                                              (local_3f0 - (barea->begin).y) * barea->jstride +
                                              lVar27 + lVar68) - (long)(barea->begin).x];
                      uStack_290 = uStack_280;
                      bcent->p[((lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] = (dVar61 * (double)puVar83 + dVar3) * dVar76
                      ;
                      bcent->p[(bcent->nstride +
                               (lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] =
                           (vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                                     (local_3f0 - (vfrac->begin).y) * vfrac->jstride +
                                     lVar27 + lVar68) - (long)(vfrac->begin).x] * (double)pEVar81 +
                           dVar73) * dVar76;
                      bcent->p[(bcent->nstride * 2 +
                               (lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] =
                           (vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                                     (local_3f0 - (vfrac->begin).y) * vfrac->jstride +
                                     lVar27 + lVar68) - (long)(vfrac->begin).x] * dVar80 + dVar74) *
                           dVar76;
                      lVar46 = (long)(local_1c8->begin).x;
                      lVar63 = (long)(local_1c8->begin).y;
                      lVar31 = (lVar66 - (local_1c8->begin).z) * local_1c8->kstride;
                      lVar37 = local_1c8->jstride * 8;
                      lVar71 = (lVar30 - lVar63) * lVar37 + lVar31 * 8;
                      pdVar13 = local_1c8->p;
                      lVar63 = (local_3f0 - lVar63) * lVar37 + lVar31 * 8;
                      lVar33 = (long)(fcz->begin).x;
                      lVar32 = (long)(fcz->begin).z;
                      lVar35 = (local_3f0 - (fcz->begin).y) * fcz->jstride;
                      lVar31 = fcz->kstride * 8;
                      lVar37 = (lVar29 - lVar32) * lVar31 + lVar35 * 8;
                      pdVar14 = fcz->p;
                      lVar32 = lVar35 * 8 + (lVar66 - lVar32) * lVar31;
                      iVar22 = (local_1d0->begin).x;
                      lVar49 = (long)(local_1d0->begin).y;
                      pdVar36 = local_1d0->p;
                      lVar47 = (long)(local_1d0->begin).z;
                      lVar35 = (lVar66 - lVar47) * local_1d0->kstride;
                      lVar31 = (local_3f0 - lVar49) * local_1d0->jstride;
                      dVar84 = *(double *)
                                ((long)pdVar13 + lVar68 * 8 + lVar71 + lVar46 * -8 + lVar28) *
                               (double)local_278 +
                               *(double *)
                                ((long)pdVar13 + lVar68 * 8 + lVar63 + lVar46 * -8 + lVar28) *
                               (double)local_1f8;
                      dVar85 = *(double *)
                                ((long)pdVar14 + lVar68 * 8 + lVar37 + lVar33 * -8 + lVar28) *
                               dVar79 + *(double *)
                                         ((long)pdVar14 + lVar68 * 8 + lVar32 + lVar33 * -8 + lVar28
                                         ) * (double)local_2b8._0_8_;
                      dVar3 = dVar85 * 0.5 + (dVar75 - local_2c8) * 0.5 + dVar84 * 0.5;
                      dVar76 = pdVar36[(lVar42 - lVar49) * local_1d0->jstride +
                                       (long)((iVar21 + iVar40) - iVar22) +
                                       (lVar38 - lVar47) * local_1d0->kstride] * dVar75 +
                               pdVar36[lVar27 + ((lVar35 + lVar31 + lVar68) - (long)iVar22)] *
                               local_2c8;
                      dVar74 = *(double *)
                                ((long)pdVar14 +
                                lVar68 * 8 + lVar37 + fcz->nstride * 8 + lVar33 * -8 + lVar28) *
                               dVar79 + *(double *)
                                         ((long)pdVar14 +
                                         lVar68 * 8 +
                                         lVar32 + fcz->nstride * 8 + lVar33 * -8 + lVar28) *
                                        (double)local_2b8._0_8_;
                      dVar86 = dVar75 * (pdVar36 +
                                        (lVar42 - lVar49) * local_1d0->jstride +
                                        (long)((iVar21 + iVar40) - iVar22) +
                                        (lVar38 - lVar47) * local_1d0->kstride)[local_1d0->nstride]
                               + local_2c8 *
                                 pdVar36[lVar27 + ((local_1d0->nstride + lVar35 + lVar31 + lVar68) -
                                                  (long)iVar22)];
                      dVar73 = *(double *)
                                ((long)pdVar13 +
                                lVar68 * 8 + lVar71 + local_1c8->nstride * 8 + lVar46 * -8 + lVar28)
                               * (double)local_278 +
                               *(double *)
                                ((long)pdVar13 +
                                lVar68 * 8 + lVar63 + local_1c8->nstride * 8 + lVar46 * -8 + lVar28)
                               * (double)local_1f8;
                      lVar46 = (long)(local_90->begin).x;
                      lVar63 = (long)(local_90->begin).y;
                      lVar31 = (lVar66 - (local_90->begin).z) * local_90->kstride;
                      lVar37 = local_90->jstride * 8;
                      lVar71 = (lVar30 - lVar63) * lVar37 + lVar31 * 8;
                      pdVar13 = local_90->p;
                      lVar63 = (local_3f0 - lVar63) * lVar37 + lVar31 * 8;
                      dVar77 = -(double)pEVar81;
                      dVar78 = -dVar80;
                      lVar49 = (long)(local_88->begin).x;
                      lVar33 = (long)(local_88->begin).z;
                      lVar32 = (local_3f0 - (local_88->begin).y) * local_88->jstride;
                      lVar31 = local_88->kstride * 8;
                      lVar37 = (lVar29 - lVar33) * lVar31 + lVar32 * 8;
                      pdVar14 = local_88->p;
                      lVar31 = (lVar66 - lVar33) * lVar31 + lVar32 * 8;
                      local_2c8 = (*(double *)
                                    ((long)pdVar14 + lVar68 * 8 + lVar37 + lVar49 * -8 + lVar28) -
                                  *(double *)
                                   ((long)pdVar14 + lVar68 * 8 + lVar31 + lVar49 * -8 + lVar28)) *
                                  dVar78 + (double)puVar83 * -0.25 * (dVar75 - local_2c8) +
                                           (*(double *)
                                             ((long)pdVar13 +
                                             lVar68 * 8 + lVar71 + lVar46 * -8 + lVar28) -
                                           *(double *)
                                            ((long)pdVar13 +
                                            lVar68 * 8 + lVar63 + lVar46 * -8 + lVar28)) * dVar77;
                      lVar32 = local_90->nstride;
                      lVar33 = local_88->nstride;
                      dVar75 = *(double *)
                                ((long)pdVar14 +
                                lVar68 * 8 + lVar37 + lVar33 * 8 + lVar49 * -8 + lVar28) -
                               *(double *)
                                ((long)pdVar14 +
                                lVar68 * 8 + lVar31 + lVar33 * 8 + lVar49 * -8 + lVar28);
                      dVar79 = dVar79 - (double)local_2b8._0_8_;
                      auVar15._8_4_ = SUB84(dVar79,0);
                      auVar15._0_8_ = dVar75;
                      auVar15._12_4_ = (int)((ulong)dVar79 >> 0x20);
                      iVar22 = (local_98->begin).x;
                      lVar35 = (long)iVar22;
                      lVar51 = (long)((iVar21 + iVar40) - iVar22);
                      lVar53 = (long)(local_98->begin).y;
                      lVar42 = (lVar42 - lVar53) * local_98->jstride;
                      pdVar36 = local_98->p;
                      lVar50 = (long)(local_98->begin).z;
                      lVar47 = (lVar38 - lVar50) * local_98->kstride;
                      lVar50 = (lVar66 - lVar50) * local_98->kstride;
                      lVar53 = (local_3f0 - lVar53) * local_98->jstride;
                      lVar38 = local_98->nstride;
                      dVar82 = -(double)puVar83;
                      uStack_200 = 0;
                      local_188 = dVar78 * dVar75 +
                                  dVar82 * (pdVar36[lVar42 + lVar51 + lVar47] -
                                           pdVar36[lVar27 + ((lVar50 + lVar53 + lVar68) - lVar35)])
                                  + (double)pEVar81 * -0.25 *
                                    ((double)local_278 - (double)local_1f8);
                      dStack_180 = dVar80 * -0.25 * dVar79 +
                                   dVar82 * (pdVar36[lVar42 + lVar51 + lVar47 + lVar38] -
                                            pdVar36[lVar27 + ((lVar38 + lVar50 + lVar53 + lVar68) -
                                                             lVar35)]) +
                                   dVar77 * (*(double *)
                                              ((long)pdVar13 +
                                              lVar68 * 8 +
                                              lVar32 * 8 + lVar71 + lVar46 * -8 + lVar28) -
                                            *(double *)
                                             ((long)pdVar13 +
                                             lVar68 * 8 + lVar32 * 8 + lVar63 + lVar46 * -8 + lVar28
                                             ));
                      local_288 = (*(double *)
                                    ((long)pdVar14 +
                                    lVar68 * 8 + lVar37 + lVar33 * 0x10 + lVar49 * -8 + lVar28) -
                                  *(double *)
                                   ((long)pdVar14 +
                                   lVar68 * 8 + lVar33 * 0x10 + lVar31 + lVar49 * -8 + lVar28)) *
                                  dVar78 + dVar76 * (double)puVar83 * -0.5 +
                                           dVar84 * (double)pEVar81 * -0.5;
                      local_80 = dVar85 * dVar80 * -0.5 +
                                 (double)puVar83 * -0.5 * dVar86 +
                                 (*(double *)
                                   ((long)pdVar13 +
                                   lVar68 * 8 + lVar71 + lVar32 * 0x10 + lVar46 * -8 + lVar28) -
                                 *(double *)
                                  ((long)pdVar13 +
                                  lVar68 * 8 + lVar32 * 0x10 + lVar63 + lVar46 * -8 + lVar28)) *
                                 dVar77;
                      local_118 = dVar80 * -0.5 * dVar74 +
                                  (pdVar36[lVar42 + lVar51 + lVar47 + lVar38 * 2] -
                                  pdVar36[lVar27 + ((lVar50 + lVar53 + lVar38 * 2 + lVar68) - lVar35
                                                   )]) * dVar82 + (double)pEVar81 * -0.5 * dVar73;
                      dVar77 = (double)pEVar81 * (double)pEVar81;
                      dVar75 = dVar77 * -3.0 + 5.0;
                      local_2e0 = local_2c8 + local_2c8;
                      local_2a8 = local_80 * 5.0 * (dVar77 + -2.0) -
                                  (double)puVar83 * local_118 * (double)pEVar81;
                      local_2f8 = (double *)
                                  (dVar74 * 0.5 +
                                  dVar76 * 0.5 + ((double)local_278 - (double)local_1f8) * 0.5);
                      local_198 = (EBCellFlag *)(dVar77 * -4.0);
                      uStack_190 = 0;
                      local_68 = (((local_188 + local_188) * (double)pEVar81 + (double)local_2f8) *
                                  (double)puVar83 + ((double)local_198 + 6.0) * local_288) *
                                 (double)pEVar81 +
                                 dVar75 * dVar3 + (double)puVar83 * local_2e0 * dVar75;
                      local_2b8._8_8_ = auVar15._8_8_;
                      local_2b8._0_8_ = dVar77 * 2.0 + 3.0;
                      local_2b8._8_8_ = (double)local_2b8._8_8_ * 0.5 + dVar86 * 0.5 + dVar73 * 0.5;
                      local_130 = (undefined1 *)((local_288 + local_288) * (double)puVar83);
                      local_108 = dVar77 + -1.0;
                      uStack_100 = 0;
                      local_f8 = local_188 * -4.0 + local_2c8 + dStack_180;
                      local_228 = (uint *)(dVar3 * (double)puVar83);
                      uStack_140 = 0;
                      uStack_110 = 0;
                      local_158 = dVar80 * dVar80;
                      local_1e8 = (uint *)(dVar80 * local_158);
                      uStack_1e0 = 0;
                      local_78 = dVar80 * (double)local_1e8;
                      dVar74 = dVar77 + dVar77;
                      local_58 = (((local_f8 + local_f8) * dVar77 +
                                  ((dStack_180 * 3.0 + local_2c8 * -7.0 + local_188 * 8.0) -
                                  (double)local_228)) * ((double)pEVar81 + (double)pEVar81) +
                                 (dVar77 * -5.0 + 4.0) * (double)local_130 +
                                 (double)local_2f8 * -8.0 * local_108) * local_158;
                      uStack_150 = 0;
                      uStack_40 = 0;
                      uStack_70 = 0;
                      local_1a8 = (double)pEVar81 * dVar77;
                      uStack_1a0 = 0;
                      local_178 = (EBCellFlag *)((double)pEVar81 * local_1a8);
                      uStack_170 = 0;
                      dVar75 = dStack_180 * -4.0 + local_188 + local_2c8;
                      local_1f8 = (uint *)(local_118 + local_118);
                      uStack_1f0 = 0;
                      dVar73 = (double)local_2b8._8_8_ * (double)pEVar81 +
                               (dVar77 * -3.0 + 4.0) * local_118;
                      dVar79 = local_288 * (double)puVar83 + (double)local_2f8;
                      local_278 = (uint *)(local_118 * -8.0 * dVar80 * local_78 +
                                          (dVar79 * -8.0 + local_f8 * 4.0 * (double)pEVar81) *
                                          local_78 +
                                          (dVar73 + dVar73) * (double)local_1e8 +
                                          local_58 +
                                          (((dVar77 * 6.0 + 4.0) * local_188 +
                                           local_2c8 * -2.0 * local_108 + (double)local_228) *
                                           (double)pEVar81 +
                                          (dVar74 + 1.0) * (double)local_130 +
                                          (dVar77 * 3.0 + 2.0) * (double)local_2f8) * 5.0 +
                                          ((dVar77 * 9.0 + 5.0 + (double)local_178) *
                                           (double)local_1f8 +
                                          ((double)local_2b8._0_8_ * (double)local_2b8._8_8_ +
                                          (dVar77 + 4.0) * (double)puVar83 * (local_80 + local_80))
                                          * (double)pEVar81) * dVar80);
                      uStack_270 = 0;
                      dVar79 = (dVar75 + dVar75) * dVar77 +
                               dVar79 * (double)pEVar81 + local_2c8 * -5.0 + dStack_180 * 15.0;
                      dVar73 = 1.0 / ((vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                                                (local_3f0 - (vfrac->begin).y) * vfrac->jstride +
                                                lVar27 + lVar68) - (long)(vfrac->begin).x] + 1e-30)
                                     * ((local_158 * -3.0 + 2.0 + local_78) * dVar74 +
                                       (local_158 + -2.0) * ((double)local_178 + (double)local_178)
                                       + local_78 * -4.0 + local_158 * 4.0 + 5.0) * 10.0);
                      local_2d8->p
                      [((lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] =
                           ((double)pEVar81 * (local_288 + local_288) * local_78 +
                           (local_2a8 + local_2a8) * (double)local_1e8 +
                           ((dVar77 * 8.0 + -15.0) * dVar3 +
                           ((local_2c8 * 16.0 + (local_188 + dStack_180) * -4.0) * (double)puVar83 +
                           local_288 * 10.0 * (double)pEVar81) * dVar77 +
                           local_288 * -22.0 * (double)pEVar81 +
                           ((double)local_2f8 * (double)pEVar81 +
                           local_2c8 * 15.0 + dStack_180 * -5.0) * (double)puVar83 * -2.0) *
                           local_158 +
                           local_68 * 5.0 +
                           ((dVar77 * -11.0 + 15.0 + (double)local_178) * (local_80 + local_80) +
                           ((5.0 - dVar74) * (double)local_2b8._8_8_ +
                           local_118 * -2.0 * (double)pEVar81 * (dVar77 + -5.0)) * (double)puVar83)
                           * dVar80) * dVar73;
                      local_2d8->p
                      [(local_2d8->nstride +
                       (lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] = (double)local_278 * dVar73;
                      local_2d8->p
                      [(local_2d8->nstride * 2 +
                       (lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] =
                           dVar73 * ((double)local_1f8 * (double)pEVar81 * local_78 +
                                    (dVar79 + dVar79) * (double)local_1e8 +
                                    (local_80 * -10.0 * (double)puVar83 * (dVar77 + -2.0) +
                                    (dVar77 * -8.0 + 15.0) * (double)local_2b8._8_8_ +
                                    local_118 * -6.0 * (double)pEVar81 * (dVar77 + -3.0)) *
                                    local_158 +
                                    (dVar75 * 4.0 * (double)local_178 +
                                    ((double)local_2f8 + (double)local_2f8) * local_1a8 +
                                    (dStack_180 * -8.0 + local_2c8 * 7.0 + local_188 * -3.0 +
                                    (double)local_228) * -2.0 * dVar77 +
                                    (dStack_180 * 4.0 + local_2e0 + (double)local_228) * 5.0 +
                                    ((double)local_2f8 * 3.0 + local_288 * 8.0 * (double)puVar83) *
                                    (double)pEVar81) * dVar80 +
                                    ((double)local_178 * 4.0 + (double)local_198 + -5.0) *
                                    (local_118 * (double)pEVar81 +
                                    local_80 * (double)puVar83 + (double)local_2b8._8_8_) * -2.0);
                      pdStack_2f0 = local_2f8;
                      local_298 = puVar83;
                      local_208 = dVar80;
                      local_148 = pEVar81;
                      dStack_f0 = dStack_180;
                      dStack_60 = dStack_180;
                      dStack_50 = dStack_180;
                      local_48 = local_158;
                    }
                    else {
                      vfrac->p[(lVar37 + lVar63 + lVar27 + lVar68) - lVar71] = 0.0;
                      local_2d8->p
                      [((lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] = 0.0;
                      local_2d8->p
                      [(local_2d8->nstride +
                       (lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] = 0.0;
                      local_2d8->p
                      [(local_2d8->nstride * 2 +
                       (lVar66 - (local_2d8->begin).z) * local_2d8->kstride +
                       (local_3f0 - (local_2d8->begin).y) * local_2d8->jstride + lVar27 + lVar68) -
                       (long)(local_2d8->begin).x] = 0.0;
                      bcent->p[((lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] = -1.0;
                      bcent->p[(bcent->nstride +
                               (lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] = -1.0;
                      bcent->p[(bcent->nstride * 2 +
                               (lVar66 - (bcent->begin).z) * bcent->kstride +
                               (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                               (long)(bcent->begin).x] = -1.0;
                      local_2a0->p
                      [((lVar66 - (local_2a0->begin).z) * local_2a0->kstride +
                       (local_3f0 - (local_2a0->begin).y) * local_2a0->jstride + lVar27 + lVar68) -
                       (long)(local_2a0->begin).x] = 0.0;
                      local_2a0->p
                      [(local_2a0->nstride +
                       (lVar66 - (local_2a0->begin).z) * local_2a0->kstride +
                       (local_3f0 - (local_2a0->begin).y) * local_2a0->jstride + lVar27 + lVar68) -
                       (long)(local_2a0->begin).x] = 0.0;
                      local_2a0->p
                      [(local_2a0->nstride * 2 +
                       (lVar66 - (local_2a0->begin).z) * local_2a0->kstride +
                       (local_3f0 - (local_2a0->begin).y) * local_2a0->jstride + lVar27 + lVar68) -
                       (long)(local_2a0->begin).x] = 0.0;
                      barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                               (local_3f0 - (barea->begin).y) * barea->jstride + lVar27 + lVar68) -
                               (long)(barea->begin).x] = 0.0;
                      cell->p[((local_3f0 - (cell->begin).y) * cell->jstride +
                              (lVar66 - (cell->begin).z) * cell->kstride + lVar27 + lVar68) -
                              (long)(cell->begin).x].flag = 0x40003;
                    }
                    bVar72 = (double)local_210 > dVar61;
                    bVar18 = false;
                    vcent = local_2d8;
                    bnorm = local_2a0;
                    goto LAB_005626a9;
                  }
                  vfrac->p[((lVar66 - (vfrac->begin).z) * vfrac->kstride +
                           (local_3f0 - (vfrac->begin).y) * vfrac->jstride + lVar27 + lVar68) -
                           (long)(vfrac->begin).x] = 0.0;
                  vcent->p[((lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  vcent->p[(vcent->nstride +
                           (lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  vcent->p[(vcent->nstride * 2 +
                           (lVar66 - (vcent->begin).z) * vcent->kstride +
                           (local_3f0 - (vcent->begin).y) * vcent->jstride + lVar27 + lVar68) -
                           (long)(vcent->begin).x] = 0.0;
                  bcent->p[((lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bcent->p[(bcent->nstride +
                           (lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bcent->p[(bcent->nstride * 2 +
                           (lVar66 - (bcent->begin).z) * bcent->kstride +
                           (local_3f0 - (bcent->begin).y) * bcent->jstride + lVar27 + lVar68) -
                           (long)(bcent->begin).x] = -1.0;
                  bnorm->p[((lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  bnorm->p[(bnorm->nstride +
                           (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  bnorm->p[(bnorm->nstride * 2 +
                           (lVar66 - (bnorm->begin).z) * bnorm->kstride +
                           (local_3f0 - (bnorm->begin).y) * bnorm->jstride + lVar27 + lVar68) -
                           (long)(bnorm->begin).x] = 0.0;
                  barea->p[((lVar66 - (barea->begin).z) * barea->kstride +
                           (local_3f0 - (barea->begin).y) * barea->jstride + lVar27 + lVar68) -
                           (long)(barea->begin).x] = 0.0;
                  cell->p[((lVar66 - (cell->begin).z) * cell->kstride +
                          (local_3f0 - (cell->begin).y) * cell->jstride + lVar27 + lVar68) -
                          (long)(cell->begin).x].flag = 0x40003;
                  bVar18 = true;
                }
                bVar72 = false;
              }
LAB_005626a9:
              if (bVar72) {
                *local_1c0 = *local_1c0 + 1;
              }
              if (bVar18) {
                local_1c0[1] = local_1c0[1] + 1;
              }
              lVar68 = lVar68 + 1;
            } while (iVar21 + -2 + (int)lVar68 <= (int)uVar12);
          }
          local_3f0 = local_3f0 + 1;
          local_1ac = local_1ac + 1;
        } while (iVar25 <= (int)local_a0);
      }
      lVar66 = lVar66 + 1;
      local_138 = (ulong)((int)local_138 + 1);
    } while (iVar55 <= (int)local_a8);
  }
  if (extend_domain_face) {
    uVar16 = *(undefined8 *)((local_e0->domain).smallend.vect + 2);
    auStack_25c[1] = (uint)((ulong)*(undefined8 *)(local_e0->domain).bigend.vect >> 0x20);
    uStack_254 = *(undefined8 *)((local_e0->domain).bigend.vect + 2);
    local_268 = *(undefined8 *)(local_e0->domain).smallend.vect;
    uStack_260 = (uint)uVar16;
    auStack_25c[0] = (uint)((ulong)uVar16 >> 0x20);
    lVar27 = 0;
    do {
      if (*(char *)((long)(local_e0->super_CoordSys).inv_dx + lVar27 + 0x19) == '\x01') {
        iVar21 = *(int *)((long)&local_268 + lVar27 * 4);
        uVar19 = auStack_25c[lVar27];
        iVar55 = *(int *)((long)&local_318 + lVar27 * 4);
        uVar62 = auStack_30c[lVar27];
        if (iVar55 < iVar21) {
          iVar21 = iVar55;
        }
        *(int *)((long)&local_268 + lVar27 * 4) = iVar21;
        if ((int)uVar62 < (int)uVar19) {
          uVar62 = uVar19;
        }
        auStack_25c[lVar27] = uVar62;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    if ((((int)local_318 < (int)(uint)local_268) || ((int)local_318._4_4_ < (int)local_268._4_4_))
       || (((int)uStack_310 < (int)uStack_260 ||
           ((((int)auStack_25c[0] < (int)auStack_30c[0] ||
             ((int)auStack_25c[1] < (int)auStack_30c[1])) ||
            ((int)(uint)uStack_254 < (int)(uint)local_304)))))) {
      local_298 = (uint *)CONCAT44(local_298._4_4_,(uint)local_304);
      local_2f8 = (double *)(ulong)uStack_310;
      if ((int)uStack_310 <= (int)(uint)local_304) {
        lVar27 = (long)(int)local_318;
        local_208 = (double)CONCAT44(local_208._4_4_,local_318._4_4_);
        local_2b8._0_4_ = auStack_30c[1];
        local_278 = (uint *)CONCAT44(local_278._4_4_,local_268._4_4_);
        local_188 = (double)CONCAT44(local_188._4_4_,(uint)uStack_254);
        local_1f8 = (uint *)(lVar27 * 4);
        local_228 = (uint *)(lVar27 * 8);
        local_288 = (double)CONCAT44(local_288._4_4_,auStack_25c[1]);
        do {
          if ((int)local_318._4_4_ <= (int)auStack_30c[1]) {
            local_2c8 = (double)(long)(int)(uint)local_2f8;
            uVar19 = (uint)uStack_254;
            if ((int)(uint)local_2f8 < (int)(uint)uStack_254) {
              uVar19 = (uint)local_2f8;
            }
            if ((int)(uint)local_2f8 < (int)uStack_260) {
              uVar19 = uStack_260;
            }
            uVar62 = local_318._4_4_;
            do {
              if ((int)local_318 <= (int)auStack_30c[0]) {
                lVar28 = (long)(int)uVar62;
                uVar44 = auStack_25c[1];
                if ((int)uVar62 < (int)auStack_25c[1]) {
                  uVar44 = uVar62;
                }
                if ((int)uVar62 < (int)local_268._4_4_) {
                  uVar44 = local_268._4_4_;
                }
                lVar31 = (long)(cell->begin).x;
                lVar57 = (long)(cell->begin).y;
                pEVar81 = cell->p;
                lVar66 = cell->jstride;
                lVar32 = (long)(cell->begin).z;
                lVar29 = cell->kstride;
                iVar21 = (vfrac->begin).x;
                iVar55 = (vfrac->begin).y;
                iVar25 = (vfrac->begin).z;
                lVar69 = (long)(local_2d8->begin).x;
                lVar53 = ((long)local_2c8 - lVar32) * lVar29;
                lVar46 = ((long)local_2c8 - (long)(local_2d8->begin).z) * local_2d8->kstride;
                lVar30 = local_2d8->nstride;
                lVar58 = (lVar28 - (local_2d8->begin).y) * local_2d8->jstride;
                lVar33 = (lVar28 - lVar57) * lVar66;
                lVar47 = (long)(bcent->begin).x;
                pEVar34 = pEVar81 + lVar27;
                lVar68 = vfrac->kstride;
                lVar71 = vfrac->jstride;
                lVar35 = ((long)local_2c8 - (long)(bcent->begin).z) * bcent->kstride;
                lVar70 = (lVar28 - (bcent->begin).y) * bcent->jstride;
                lVar38 = bcent->nstride;
                pdVar13 = vfrac->p;
                pdVar48 = local_2d8->p + lVar27;
                pdVar59 = bcent->p + lVar27;
                lVar63 = local_2a0->nstride;
                lVar60 = ((long)local_2c8 - (long)(local_2a0->begin).z) * local_2a0->kstride;
                lVar49 = (lVar28 - (local_2a0->begin).y) * local_2a0->jstride;
                lVar50 = (long)(local_2a0->begin).x;
                pdVar36 = local_2a0->p + lVar27;
                iVar22 = (barea->begin).z;
                iVar40 = (barea->begin).y;
                lVar37 = barea->kstride;
                lVar42 = barea->jstride;
                iVar39 = (barea->begin).x;
                pdVar14 = barea->p;
                lVar51 = 0;
                do {
                  uVar20 = (int)local_318 + (int)lVar51;
                  if ((int)auStack_25c[0] <= (int)uVar20) {
                    uVar20 = auStack_25c[0];
                  }
                  lVar2 = lVar27 + lVar51;
                  if (lVar2 < (int)(uint)local_268) {
                    uVar20 = (uint)local_268;
                  }
                  if ((((lVar2 < (int)(uint)local_268 || (int)auStack_25c[1] < (int)uVar62) ||
                        ((int)uVar62 < (int)local_268._4_4_ ||
                        ((int)(uint)local_2f8 < (int)uStack_260 ||
                        (int)(uint)uStack_254 < (int)(uint)local_2f8))) ||
                      ((int)auStack_25c[0] < lVar2)) &&
                     (((~pEVar34[(lVar53 + lVar33 + lVar51) - lVar31].flag & 3) != 0 &&
                      ((~pEVar81[((int)uVar44 - lVar57) * lVar66 +
                                 ((int)uVar19 - lVar32) * lVar29 + ((int)uVar20 - lVar31)].flag & 3)
                       == 0)))) {
                    *local_1c0 = *local_1c0 + 1;
                    (pdVar13 + lVar27)
                    [(((long)local_2c8 - (long)iVar25) * lVar68 +
                     (lVar28 - iVar55) * lVar71 + lVar51) - (long)iVar21] = 0.0;
                    pdVar48[(lVar46 + lVar58 + lVar51) - lVar69] = 0.0;
                    pdVar48[(lVar30 + lVar46 + lVar58 + lVar51) - lVar69] = 0.0;
                    pdVar48[(lVar46 + lVar58 + lVar30 * 2 + lVar51) - lVar69] = 0.0;
                    pdVar59[(lVar35 + lVar70 + lVar51) - lVar47] = -1.0;
                    pdVar59[(lVar38 + lVar35 + lVar70 + lVar51) - lVar47] = -1.0;
                    pdVar59[(lVar35 + lVar70 + lVar38 * 2 + lVar51) - lVar47] = -1.0;
                    pdVar36[(lVar60 + lVar49 + lVar51) - lVar50] = 0.0;
                    pdVar36[(lVar63 + lVar60 + lVar49 + lVar51) - lVar50] = 0.0;
                    pdVar36[(lVar60 + lVar49 + lVar63 * 2 + lVar51) - lVar50] = 0.0;
                    (pdVar14 + lVar27)
                    [(((long)local_2c8 - (long)iVar22) * lVar37 +
                     (lVar28 - iVar40) * lVar42 + lVar51) - (long)iVar39] = 0.0;
                    pEVar34[(lVar53 + lVar33 + lVar51) - lVar31].flag = 0x40003;
                  }
                  lVar51 = lVar51 + 1;
                } while (~auStack_30c[0] + (int)local_318 + (int)lVar51 != 0);
              }
              bVar72 = uVar62 != auStack_30c[1];
              uVar62 = uVar62 + 1;
            } while (bVar72);
          }
          uVar19 = (uint)local_2f8 + 1;
          bVar72 = (uint)local_2f8 != (uint)local_304;
          local_2f8 = (double *)(ulong)uVar19;
        } while (bVar72);
      }
    }
  }
  *local_c8 = *local_c8 + *local_1c0;
  iVar21 = *local_d0 + local_1c0[1];
  *local_d0 = iVar21;
  if (iVar21 < 1 && *local_c8 < 1) {
    if ((int)local_240 <= local_1b4) {
      uVar54 = local_240;
      do {
        iVar21 = (int)uVar54;
        if ((int)local_2d0 <= (int)local_22c) {
          local_198 = cell->p;
          local_1a8 = (double)cell->jstride;
          local_2a8 = (double)cell->kstride;
          iVar55 = iVar21 + 1;
          local_178 = local_238->p;
          local_158 = (double)local_238->jstride;
          local_188 = (double)local_238->kstride;
          uVar19 = local_2d0;
          do {
            if (local_2cc <= (int)local_1b0) {
              local_298 = local_128->p;
              lVar27 = local_128->jstride;
              lVar28 = local_128->kstride;
              local_1c8 = (Array4<const_double> *)local_160->p;
              local_1d0 = (Array4<const_double> *)local_160->jstride;
              lVar66 = local_160->kstride;
              iVar22 = uVar19 + 1;
              puVar83 = local_120->p;
              lVar29 = local_120->jstride;
              local_2e0 = (double)local_120->kstride;
              iVar25 = local_2cc;
              do {
                lVar30 = (long)(int)uVar19;
                puVar65 = (uint *)(long)iVar21;
                dVar61 = (double)(((long)puVar65 - (long)(cell->begin).z) * (long)local_2a8);
                pEVar81 = local_198 +
                          (lVar30 - (cell->begin).y) * (long)local_1a8 +
                          (long)(iVar25 - (cell->begin).x);
                uVar62 = pEVar81[(long)dVar61].flag;
                if ((~uVar62 & 3) == 0) {
                  uVar44 = uVar62 & 0x1f;
                }
                else {
                  iVar40 = (local_128->begin).x;
                  uVar44 = (local_128->begin).y;
                  local_2f8 = (double *)(long)(iVar25 - iVar40);
                  lVar68 = (int)(uVar19 - uVar44) * lVar27;
                  uVar20 = (local_128->begin).z;
                  lVar71 = (int)(iVar21 - uVar20) * lVar28;
                  local_228 = local_298 + (long)(lVar68 + (long)local_2f8);
                  uVar4 = local_228[lVar71];
                  uVar24 = uVar62 & 0xfffdffff;
                  if (uVar4 != 1) {
                    uVar24 = uVar62;
                  }
                  local_288 = (double)(long)((iVar25 - iVar40) + 1);
                  local_2d8 = (Array4<double> *)(local_298 + lVar68 + (long)local_288);
                  uVar62 = *(uint *)((long)&local_2d8->p + lVar71 * 4);
                  uVar7 = uVar24 & 0xfff7ffff;
                  if (uVar62 != 1) {
                    uVar7 = uVar24;
                  }
                  uVar24 = (local_160->begin).x;
                  iVar40 = (local_160->begin).y;
                  iVar39 = iVar25 - uVar24;
                  uVar5 = (local_160->begin).z;
                  lVar68 = (int)(iVar21 - uVar5) * lVar66;
                  local_210 = (uint *)((long)&local_1c8->p +
                                      (long)(int)(uVar19 - iVar40) * (long)local_1d0 * 4);
                  local_1f8 = local_210 + iVar39;
                  uVar6 = local_1f8[lVar68];
                  uVar8 = uVar7 & 0xffff7fff;
                  if (uVar6 != 1) {
                    uVar8 = uVar7;
                  }
                  local_2a0 = (Array4<double> *)
                              ((long)&local_1c8->p + (long)(iVar22 - iVar40) * (long)local_1d0 * 4);
                  local_278 = (uint *)((long)&local_2a0->p + (long)iVar39 * 4);
                  uVar7 = local_278[lVar68];
                  uVar11 = uVar8 & 0xffdfffff;
                  if (uVar7 != 1) {
                    uVar11 = uVar8;
                  }
                  uVar8 = (local_120->begin).x;
                  iVar67 = iVar25 - uVar8;
                  uVar9 = (local_120->begin).y;
                  local_2b8._0_4_ = uVar9;
                  lVar63 = (int)(uVar19 - uVar9) * lVar29;
                  iVar40 = (local_120->begin).z;
                  lVar38 = (long)(iVar21 - iVar40) * (long)local_2e0;
                  local_2c8 = (double)(long)iVar67;
                  uVar10 = puVar83[lVar63 + (long)local_2c8 + lVar38];
                  uVar64 = uVar11 & 0xfffffdff;
                  if (uVar10 != 1) {
                    uVar64 = uVar11;
                  }
                  lVar37 = (long)(iVar55 - iVar40) * (long)local_2e0;
                  uVar11 = puVar83[lVar63 + (long)local_2c8 + lVar37];
                  uVar23 = uVar64 & 0xf7ffffff;
                  if (uVar11 != 1) {
                    uVar23 = uVar64;
                  }
                  if ((uVar4 == 1) || (local_210[(int)(~uVar24 + iVar25) + lVar68] == 1)) {
                    uVar64 = uVar23 & 0xffffbfff;
                    if (uVar6 == 1) {
                      uVar23 = uVar64;
                    }
                    if (local_298[(long)local_2f8 + (int)(uVar19 + ~uVar44) * lVar27 + lVar71] == 1)
                    {
                      uVar23 = uVar64;
                    }
                  }
                  uVar64 = uVar23;
                  if ((uVar62 == 1) || (local_210[(iVar39 + 1) + lVar68] == 1)) {
                    if (uVar6 == 1) {
                      uVar64 = uVar23 & 0xfffeffff;
                    }
                    if (local_298[(int)(~uVar44 + uVar19) * lVar27 + (long)local_288 + lVar71] == 1)
                    {
                      uVar64 = uVar23 & 0xfffeffff;
                    }
                  }
                  uVar23 = uVar64;
                  if ((uVar4 == 1) ||
                     (*(int *)((long)&local_2a0->p + lVar68 * 4 + (long)(int)(~uVar24 + iVar25) * 4)
                      == 1)) {
                    if (uVar7 == 1) {
                      uVar23 = uVar64 & 0xffefffff;
                    }
                    if (local_298[(long)local_2f8 + (int)(iVar22 - uVar44) * lVar27 + lVar71] == 1)
                    {
                      uVar23 = uVar64 & 0xffefffff;
                    }
                  }
                  uVar24 = uVar23;
                  if ((uVar62 == 1) ||
                     (*(int *)((long)&local_2a0->p + lVar68 * 4 + (long)(iVar39 + 1) * 4) == 1)) {
                    if (uVar7 == 1) {
                      uVar24 = uVar23 & 0xffbfffff;
                    }
                    if (local_298[(int)(iVar22 - uVar44) * lVar27 + (long)local_288 + lVar71] == 1)
                    {
                      uVar24 = uVar23 & 0xffbfffff;
                    }
                  }
                  uVar44 = uVar24;
                  if ((uVar4 == 1) || (puVar83[lVar63 + (int)(~uVar8 + iVar25) + lVar38] == 1)) {
                    if (uVar10 == 1) {
                      uVar44 = uVar24 & 0xfffffeff;
                    }
                    if (local_228[(int)(~uVar20 + iVar21) * lVar28] == 1) {
                      uVar44 = uVar24 & 0xfffffeff;
                    }
                  }
                  uVar24 = uVar44;
                  if ((uVar62 == 1) || (puVar83[lVar63 + (iVar67 + 1) + lVar38] == 1)) {
                    if (uVar10 == 1) {
                      uVar24 = uVar44 & 0xfffffbff;
                    }
                    if (*(uint *)((long)&local_2d8->p + (int)(~uVar20 + iVar21) * lVar28 * 4) == 1)
                    {
                      uVar24 = uVar44 & 0xfffffbff;
                    }
                  }
                  if ((uVar4 == 1) || (puVar83[lVar63 + (int)(~uVar8 + iVar25) + lVar37] == 1)) {
                    uVar44 = uVar24 & 0xfbffffff;
                    if (uVar11 == 1) {
                      uVar24 = uVar44;
                    }
                    if (local_228[(int)(iVar55 - uVar20) * lVar28] == 1) {
                      uVar24 = uVar44;
                    }
                  }
                  uVar44 = uVar24;
                  if ((uVar62 == 1) || (puVar83[lVar63 + (iVar67 + 1) + lVar37] == 1)) {
                    if (uVar11 == 1) {
                      uVar44 = uVar24 & 0xefffffff;
                    }
                    if (*(uint *)((long)&local_2d8->p + (int)(iVar55 - uVar20) * lVar28 * 4) == 1) {
                      uVar44 = uVar24 & 0xefffffff;
                    }
                  }
                  uVar62 = uVar44;
                  if ((uVar6 == 1) ||
                     (puVar83[(int)(~uVar9 + uVar19) * lVar29 + (long)local_2c8 + lVar38] == 1)) {
                    if (uVar10 == 1) {
                      uVar62 = uVar44 & 0xffffffbf;
                    }
                    if (local_1f8[(int)(~uVar5 + iVar21) * lVar66] == 1) {
                      uVar62 = uVar44 & 0xffffffbf;
                    }
                  }
                  uVar44 = uVar62;
                  if ((uVar7 == 1) ||
                     (puVar83[(int)(iVar22 - uVar9) * lVar29 + (long)local_2c8 + lVar38] == 1)) {
                    if (uVar10 == 1) {
                      uVar44 = uVar62 & 0xffffefff;
                    }
                    if (local_278[(int)(~uVar5 + iVar21) * lVar66] == 1) {
                      uVar44 = uVar62 & 0xffffefff;
                    }
                  }
                  uVar62 = uVar44;
                  if ((uVar6 == 1) ||
                     (puVar83[(int)(~uVar9 + uVar19) * lVar29 + (long)local_2c8 + lVar37] == 1)) {
                    if (uVar11 == 1) {
                      uVar62 = uVar44 & 0xfeffffff;
                    }
                    if (local_1f8[(int)(iVar55 - uVar5) * lVar66] == 1) {
                      uVar62 = uVar44 & 0xfeffffff;
                    }
                  }
                  uVar44 = uVar62;
                  local_208 = dVar61;
                  local_1e8 = puVar65;
                  local_148 = pEVar81;
                  if ((uVar7 == 1) ||
                     (puVar83[(int)(iVar22 - uVar9) * lVar29 + (long)local_2c8 + lVar37] == 1)) {
                    if (uVar11 == 1) {
                      uVar44 = uVar62 & 0xbfffffff;
                    }
                    if (local_278[(int)(iVar55 - uVar5) * lVar66] == 1) {
                      uVar44 = uVar62 & 0xbfffffff;
                    }
                  }
                }
                pEVar81[(long)dVar61].flag = uVar44;
                local_178[(lVar30 - (local_238->begin).y) * (long)local_158 +
                          (long)(iVar25 - (local_238->begin).x) +
                          ((long)puVar65 - (long)(local_238->begin).z) * (long)local_188].flag =
                     local_198[(lVar30 - (cell->begin).y) * (long)local_1a8 +
                               (long)(iVar25 - (cell->begin).x) +
                               ((long)puVar65 - (long)(cell->begin).z) * (long)local_2a8].flag;
                iVar40 = iVar25 - uVar12;
                iVar25 = iVar25 + 1;
              } while (iVar40 != 1);
            }
            bVar72 = uVar19 != local_22c;
            local_240 = uVar54;
            uVar19 = uVar19 + 1;
          } while (bVar72);
        }
        uVar54 = (ulong)(iVar21 + 1);
      } while (iVar21 != local_1b4);
    }
    iVar21 = (local_d8->smallend).vect[2];
    iVar55 = (local_d8->bigend).vect[2];
    uVar16 = local_268;
    if (iVar21 <= iVar55) {
      iVar25 = (local_d8->smallend).vect[0];
      iVar22 = (local_d8->smallend).vect[1];
      iVar40 = (local_d8->bigend).vect[0];
      iVar39 = (local_d8->bigend).vect[1];
      do {
        if (iVar22 <= iVar39) {
          pEVar81 = cell->p;
          lVar27 = cell->jstride;
          lVar28 = cell->kstride;
          iVar26 = iVar21 + 1;
          iVar67 = iVar22;
          do {
            if (iVar25 <= iVar40) {
              pEVar34 = local_238->p;
              lVar66 = local_238->jstride;
              lVar29 = local_238->kstride;
              iVar41 = iVar67 + 1;
              iVar45 = iVar25;
              do {
                lVar30 = (long)(iVar45 - (cell->begin).x);
                lVar68 = ((long)iVar67 - (long)(cell->begin).y) * lVar27;
                lVar71 = ((long)iVar21 - (long)(cell->begin).z) * lVar28;
                if ((~pEVar81[lVar68 + lVar30 + lVar71].flag & 3) != 0) {
                  uVar12 = (local_238->begin).x;
                  uVar19 = (local_238->begin).y;
                  iVar56 = iVar45 - uVar12;
                  lVar38 = (long)iVar56;
                  lVar63 = (int)(iVar67 - uVar19) * lVar66;
                  uVar62 = (local_238->begin).z;
                  lVar37 = (int)(iVar21 - uVar62) * lVar29;
                  uVar44 = pEVar34[lVar63 + lVar38 + lVar37].flag;
                  sVar52 = (short)uVar44;
                  uVar20 = uVar44;
                  if (((((uVar44 >> 0x11 & 1) == 0) ||
                       ((pEVar34[lVar63 + (int)(~uVar12 + iVar45) + lVar37].flag & 0x40) == 0)) &&
                      ((-1 < sVar52 ||
                       ((pEVar34[(int)(~uVar19 + iVar67) * lVar66 + lVar38 + lVar37].flag & 0x100)
                        == 0)))) &&
                     (((uVar44 >> 9 & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(~uVar62 + iVar21) * lVar29].flag & 0x4000)
                       == 0)))) {
                    uVar20 = uVar44 & 0xffffffdf;
                  }
                  if (((((uVar44 >> 0x13 & 1) == 0) ||
                       ((pEVar34[lVar63 + (iVar56 + 1) + lVar37].flag & 0x40) == 0)) &&
                      ((-1 < sVar52 ||
                       ((pEVar34[(int)(~uVar19 + iVar67) * lVar66 + lVar38 + lVar37].flag & 0x400)
                        == 0)))) &&
                     (((uVar44 >> 9 & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(~uVar62 + iVar21) * lVar29].flag & 0x10000)
                       == 0)))) {
                    uVar20 = uVar20 & 0xffffff7f;
                  }
                  if (((((uVar44 >> 0x11 & 1) == 0) ||
                       ((pEVar34[lVar63 + (int)(~uVar12 + iVar45) + lVar37].flag & 0x1000) == 0)) &&
                      (((uVar44 >> 0x15 & 1) == 0 ||
                       ((pEVar34[(int)(iVar41 - uVar19) * lVar66 + lVar38 + lVar37].flag & 0x100) ==
                        0)))) &&
                     (((uVar44 >> 9 & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(~uVar62 + iVar21) * lVar29].flag & 0x100000)
                       == 0)))) {
                    uVar20 = uVar20 & 0xfffff7ff;
                  }
                  if (((((uVar44 >> 0x13 & 1) == 0) ||
                       ((pEVar34[lVar63 + (iVar56 + 1) + lVar37].flag & 0x1000) == 0)) &&
                      (((uVar44 >> 0x15 & 1) == 0 ||
                       ((pEVar34[(int)(iVar41 - uVar19) * lVar66 + lVar38 + lVar37].flag & 0x400) ==
                        0)))) &&
                     (((uVar44 >> 9 & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(~uVar62 + iVar21) * lVar29].flag & 0x400000)
                       == 0)))) {
                    uVar20 = uVar20 & 0xffffdfff;
                  }
                  if (((((uVar44 >> 0x11 & 1) == 0) ||
                       ((pEVar34[lVar63 + (int)(~uVar12 + iVar45) + lVar37].flag & 0x1000000) == 0))
                      && ((-1 < sVar52 ||
                          ((pEVar34[(int)(~uVar19 + iVar67) * lVar66 + lVar38 + lVar37].flag &
                           0x4000000) == 0)))) &&
                     (((uVar44 >> 0x1b & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(iVar26 - uVar62) * lVar29].flag & 0x4000) ==
                       0)))) {
                    uVar20 = uVar20 & 0xff7fffff;
                  }
                  if (((((uVar44 >> 0x13 & 1) == 0) ||
                       ((pEVar34[lVar63 + (iVar56 + 1) + lVar37].flag & 0x1000000) == 0)) &&
                      ((-1 < sVar52 ||
                       ((pEVar34[(int)(~uVar19 + iVar67) * lVar66 + lVar38 + lVar37].flag &
                        0x10000000) == 0)))) &&
                     (((uVar44 >> 0x1b & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(iVar26 - uVar62) * lVar29].flag & 0x10000)
                       == 0)))) {
                    uVar20 = uVar20 & 0xfdffffff;
                  }
                  if (((((uVar44 >> 0x11 & 1) == 0) ||
                       ((pEVar34[lVar63 + (int)(~uVar12 + iVar45) + lVar37].flag & 0x40000000) == 0)
                       ) && (((uVar44 >> 0x15 & 1) == 0 ||
                             ((pEVar34[(int)(iVar41 - uVar19) * lVar66 + lVar38 + lVar37].flag &
                              0x4000000) == 0)))) &&
                     (((uVar44 >> 0x1b & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(iVar26 - uVar62) * lVar29].flag & 0x100000)
                       == 0)))) {
                    uVar20 = uVar20 & 0xdfffffff;
                  }
                  if (((((uVar44 >> 0x13 & 1) == 0) ||
                       ((pEVar34[lVar63 + (iVar56 + 1) + lVar37].flag & 0x40000000) == 0)) &&
                      (((uVar44 >> 0x15 & 1) == 0 ||
                       ((pEVar34[(int)(iVar41 - uVar19) * lVar66 + lVar38 + lVar37].flag &
                        0x10000000) == 0)))) &&
                     (((uVar44 >> 0x1b & 1) == 0 ||
                      ((pEVar34[lVar63 + lVar38 + (int)(iVar26 - uVar62) * lVar29].flag & 0x400000)
                       == 0)))) {
                    uVar20 = uVar20 & 0x7fffffff;
                  }
                  pEVar81[lVar68 + lVar30 + lVar71].flag = uVar20;
                }
                iVar45 = iVar45 + 1;
              } while (iVar40 + 1 != iVar45);
            }
            bVar72 = iVar67 != iVar39;
            iVar67 = iVar67 + 1;
          } while (bVar72);
        }
        bVar72 = iVar21 != iVar55;
        iVar21 = iVar21 + 1;
      } while (bVar72);
    }
  }
  else {
    local_188 = (double)CONCAT71(local_188._1_7_,!cover_multiple_cuts);
    if (0 < iVar21 && !cover_multiple_cuts) {
      Abort_host("amrex::EB2::build_cells: multi-cuts not supported");
    }
    auStack_25c[1] = auStack_30c[1];
    uStack_254 = local_304;
    local_268 = local_318;
    uVar16 = local_268;
    uStack_260 = uStack_310;
    auStack_25c[0] = auStack_30c[0];
    lVar27 = 0;
    do {
      if ((uStack_254._4_4_ >> ((uint)lVar27 & 0x1f) & 1) == 0) {
        auStack_25c[lVar27] = auStack_25c[lVar27] + 1;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != 3);
    iVar21 = (uint)local_304 + ((local_304 & 0x400000000) == 0);
    uStack_254 = CONCAT44(7,(uint)uStack_254);
    local_f8 = (double)CONCAT44(local_f8._4_4_,(uint)uStack_254);
    if ((int)uStack_310 <= (int)(uint)uStack_254) {
      local_108 = (double)(ulong)auStack_25c[1];
      local_268._4_4_ = (uint)((ulong)local_318 >> 0x20);
      local_178 = (EBCellFlag *)(long)(int)local_268._4_4_;
      local_268._0_4_ = (uint)local_318;
      lVar30 = (long)(int)(uint)local_268;
      local_2a8 = (double)(long)(int)auStack_30c[1];
      local_238 = (Array4<amrex::EBCellFlag> *)(long)(int)auStack_30c[0];
      lVar66 = (long)(int)local_268._4_4_;
      lVar29 = (long)(int)(uint)local_268;
      lVar28 = (long)(int)((~local_304._4_4_ & 1) + auStack_30c[0]);
      lVar27 = (long)(int)(auStack_30c[1] + ((local_304 & 0x200000000) == 0));
      local_130 = (undefined1 *)((long)&local_178[-1].flag + 3);
      local_158 = (double)CONCAT44(local_158._4_4_,uStack_310 - 1);
      local_278 = (uint *)(lVar30 * 4);
      local_118 = (double)(lVar30 * 8);
      uVar12 = uStack_260;
      do {
        if ((int)local_268._4_4_ <= (int)auStack_25c[1]) {
          lVar68 = (long)local_158._0_4_;
          local_2b8._0_8_ = lVar68;
          local_2c8 = (double)(long)(int)uVar12;
          iVar55 = uVar12 - 1;
          lVar71 = local_c0->jstride * 8;
          local_3f0 = (long)local_c0->p +
                      ((long)local_178 - (long)(local_c0->begin).y) * lVar71 +
                      ((long)local_2c8 - (long)(local_c0->begin).z) * local_c0->kstride * 8 +
                      (long)(local_c0->begin).x * -8 + (long)local_118;
          pEVar81 = local_178;
          local_3b8 = local_130;
          do {
            if ((int)(uint)local_268 <= (int)auStack_25c[0]) {
              lVar63 = (long)(cell->begin).y;
              local_208 = (double)cell->jstride;
              lVar42 = (long)(cell->begin).z;
              local_2f8 = (double *)cell->kstride;
              lVar33 = (long)(local_160->begin).z;
              lVar38 = local_160->kstride;
              lVar35 = (long)local_3b8 - lVar63;
              lVar37 = (long)local_208 * lVar35 + lVar30;
              lVar50 = lVar68 - lVar42;
              lVar46 = (long)local_2f8 * lVar50;
              local_288 = (double)((long)pEVar81 - lVar63);
              lVar47 = (long)local_208 * (long)local_288 + lVar30;
              lVar42 = (long)local_2c8 - lVar42;
              lVar63 = (long)local_2f8 * lVar42;
              local_1f8 = (uint *)(lVar37 + lVar63);
              local_228 = (uint *)(lVar63 + lVar47);
              lVar51 = ((long)pEVar81 - (long)(local_160->begin).y) * local_160->jstride;
              lVar57 = lVar68 - lVar33;
              lVar33 = (long)local_2c8 - lVar33;
              lVar31 = (long)(local_120->begin).y;
              lVar53 = (long)local_3b8 - lVar31;
              lVar31 = (long)pEVar81 - lVar31;
              lVar63 = local_120->jstride;
              lVar49 = ((long)local_2c8 - (long)(local_120->begin).z) * local_120->kstride;
              lVar32 = (long)(local_120->begin).x;
              puVar83 = local_120->p;
              local_2a0 = (Array4<double> *)
                          (puVar83 + ((lVar63 * lVar53 + lVar30 + lVar49 + -1) - lVar32));
              local_1d0 = (Array4<const_double> *)
                          (puVar83 + ((lVar63 * lVar31 + lVar30 + lVar49 + -1) - lVar32));
              local_2e0 = (double)(lVar31 * lVar63 * 4 + lVar49 * 4 + lVar32 * -4 +
                                  (long)(puVar83 + lVar30));
              local_210 = (uint *)(lVar63 * 4 * lVar53 + lVar49 * 4 + lVar32 * -4 +
                                  (long)(puVar83 + lVar30));
              lVar31 = (long)(local_160->begin).x;
              puVar83 = local_160->p;
              local_1e8 = puVar83 + ((lVar38 * lVar33 + lVar30 + lVar51 + -1) - lVar31);
              local_2d8 = (Array4<double> *)
                          (lVar33 * lVar38 * 4 + lVar51 * 4 + lVar31 * -4 + (long)(puVar83 + lVar30)
                          );
              local_148 = (EBCellFlag *)
                          (lVar38 * 4 * lVar57 + lVar51 * 4 + lVar31 * -4 + (long)(puVar83 + lVar30)
                          );
              lVar33 = (long)(local_128->begin).y;
              lVar32 = local_128->jstride * 4;
              lVar63 = ((long)pEVar81 - lVar33) * lVar32;
              lVar32 = ((long)local_3b8 - lVar33) * lVar32;
              lVar33 = (long)(local_128->begin).z;
              lVar49 = local_128->kstride * 4;
              lVar53 = ((long)local_2c8 - lVar33) * lVar49;
              lVar49 = (lVar68 - lVar33) * lVar49;
              lVar33 = (long)(local_128->begin).x;
              local_298 = local_128->p + lVar30;
              local_1a8 = (double)(lVar63 + lVar53 + lVar33 * -4 + (long)local_298);
              local_240 = lVar53 + lVar32 + lVar33 * -4 + (long)local_298;
              local_1c8 = (Array4<const_double> *)(lVar63 + lVar49 + lVar33 * -4 + (long)local_298);
              local_298 = (uint *)(lVar49 + lVar32 + lVar33 * -4 + (long)local_298);
              lVar33 = (long)local_288 * (long)local_208 * 4;
              lVar35 = (long)local_208 * 4 * lVar35;
              lVar42 = lVar42 * (long)local_2f8 * 4;
              lVar50 = (long)local_2f8 * 4 * lVar50;
              lVar63 = (long)(cell->begin).x;
              pEVar34 = cell->p;
              pEVar43 = pEVar34 + lVar30;
              puVar1 = (undefined1 *)((long)&pEVar81[-1].flag + 3);
              lVar32 = 0;
              do {
                pdVar13 = (double *)(local_3f0 + lVar32 * 8);
                if (*pdVar13 <= 0.0 && *pdVar13 != 0.0) {
                  lVar49 = lVar30 + lVar32;
                  lVar53 = lVar30 + lVar32 + -1;
                  if ((((((((lVar49 <= lVar29) || ((long)local_238 < lVar53)) ||
                          ((long)pEVar81 <= lVar66)) ||
                         (((long)local_2a8 < (long)puVar1 || ((int)uVar12 <= (int)uStack_310)))) ||
                        (((int)(uint)local_304 < iVar55 ||
                         ((~pEVar34[(lVar37 + lVar46 + lVar32 + -1) - lVar63].flag & 3) != 0)))) &&
                       ((((lVar49 < lVar29 || ((long)local_238 < lVar49)) ||
                         ((long)pEVar81 <= lVar66)) ||
                        (((((long)local_2a8 < (long)puVar1 || ((int)uVar12 <= (int)uStack_310)) ||
                          ((int)(uint)local_304 < iVar55)) ||
                         ((~*(uint *)((long)&pEVar43[lVar32 - lVar63].flag + lVar50 + lVar35) & 3)
                          != 0)))))) &&
                      ((((lVar49 <= lVar29 || ((long)local_238 < lVar53)) ||
                        (((((long)pEVar81 < lVar66 ||
                           (((long)local_2a8 < (long)pEVar81 || ((int)uVar12 <= (int)uStack_310))))
                          || ((int)(uint)local_304 < iVar55)) ||
                         ((~pEVar34[(lVar46 + lVar47 + lVar32 + -1) - lVar63].flag & 3) != 0)))) &&
                       ((((((lVar49 < lVar29 || ((long)local_238 < lVar49)) ||
                           ((long)pEVar81 < lVar66)) ||
                          (((long)local_2a8 < (long)pEVar81 || ((int)uVar12 <= (int)uStack_310))))
                         || (((int)(uint)local_304 < iVar55 ||
                             ((~*(uint *)((long)&pEVar43[lVar32 - lVar63].flag + lVar33 + lVar50) &
                              3) != 0)))) &&
                        ((((lVar49 <= lVar29 || ((long)local_238 < lVar53)) ||
                          ((long)pEVar81 <= lVar66)) ||
                         (((((long)local_2a8 < (long)puVar1 || ((int)uVar12 < (int)uStack_310)) ||
                           ((int)(uint)local_304 < (int)uVar12)) ||
                          ((~pEVar34[(long)local_1f8 + ((lVar32 + -1) - lVar63)].flag & 3) != 0)))))
                        ))))) &&
                     (((((lVar49 < lVar29 || ((long)local_238 < lVar49)) ||
                        (((long)pEVar81 <= lVar66 ||
                         (((long)local_2a8 < (long)puVar1 || ((int)uVar12 < (int)uStack_310)))))) ||
                       (((int)(uint)local_304 < (int)uVar12 ||
                        ((~*(uint *)((long)&pEVar43[lVar32 - lVar63].flag + lVar42 + lVar35) & 3) !=
                         0)))) &&
                      ((((lVar49 <= lVar29 || ((long)local_238 < lVar53)) ||
                        ((long)pEVar81 < lVar66)) ||
                       ((((long)local_2a8 < (long)pEVar81 || ((int)uVar12 < (int)uStack_310)) ||
                        (((int)(uint)local_304 < (int)uVar12 ||
                         ((~pEVar34[(long)local_228 + ((lVar32 + -1) - lVar63)].flag & 3) != 0))))))
                      )))) {
                    if ((((lVar49 < lVar29) || ((long)local_238 < lVar49)) ||
                        ((long)pEVar81 < lVar66)) ||
                       ((((long)local_2a8 < (long)pEVar81 || ((int)uVar12 < (int)uStack_310)) ||
                        ((int)(uint)local_304 < (int)uVar12)))) {
                      if (!cover_multiple_cuts) goto LAB_00563a25;
LAB_00563734:
                      if (((lVar29 <= lVar49) &&
                          ((((lVar49 <= lVar28 && (lVar66 < (long)pEVar81)) &&
                            ((((long)puVar1 <= (long)local_2a8 &&
                              (((int)uStack_310 < (int)uVar12 && (iVar55 <= (int)(uint)local_304))))
                             && (local_298[lVar32] == 1)))) ||
                           ((lVar29 <= lVar49 &&
                            ((((((lVar49 <= lVar28 && (lVar66 <= (long)pEVar81)) &&
                                ((long)pEVar81 <= (long)local_2a8)) &&
                               (((int)uStack_310 < (int)uVar12 && (iVar55 <= (int)(uint)local_304)))
                               ) && (*(uint *)((long)&local_1c8->p + lVar32 * 4) == 1)) ||
                             ((lVar29 <= lVar49 &&
                              ((((lVar49 <= lVar28 && (lVar66 < (long)pEVar81)) &&
                                (((long)puVar1 <= (long)local_2a8 &&
                                 ((((int)uStack_310 <= (int)uVar12 &&
                                   ((int)uVar12 <= (int)(uint)local_304)) &&
                                  (*(int *)(local_240 + lVar32 * 4) == 1)))))) ||
                               ((((lVar29 <= lVar49 && (lVar49 <= lVar28)) &&
                                 (lVar66 <= (long)pEVar81)) &&
                                ((((long)pEVar81 <= (long)local_2a8 &&
                                  ((int)uStack_310 <= (int)uVar12)) &&
                                 (((int)uVar12 <= (int)(uint)local_304 &&
                                  (*(int *)((long)local_1a8 + lVar32 * 4) == 1)))))))))))))))))) ||
                         (((((((((((lVar29 < lVar49 && (lVar53 <= (long)local_238)) &&
                                  (lVar66 <= (long)pEVar81)) &&
                                 (((long)pEVar81 <= lVar27 && ((int)uStack_310 < (int)uVar12)))) &&
                                (iVar55 <= (int)(uint)local_304)) &&
                               (puVar83[(lVar38 * lVar57 + lVar30 + lVar51 + lVar32 + -1) - lVar31]
                                == 1)) ||
                              (((lVar29 <= lVar49 && (lVar49 <= (long)local_238)) &&
                               ((lVar66 <= (long)pEVar81 &&
                                (((((long)pEVar81 <= lVar27 && ((int)uStack_310 < (int)uVar12)) &&
                                  (iVar55 <= (int)(uint)local_304)) && (local_148[lVar32].flag == 1)
                                 ))))))) ||
                             (((lVar29 < lVar49 && (lVar53 <= (long)local_238)) &&
                              ((lVar66 <= (long)pEVar81 &&
                               ((((long)pEVar81 <= lVar27 && ((int)uStack_310 <= (int)uVar12)) &&
                                (((int)uVar12 <= (int)(uint)local_304 && (local_1e8[lVar32] == 1))))
                               )))))) ||
                            (((((lVar29 <= lVar49 && (lVar49 <= (long)local_238)) &&
                               (lVar66 <= (long)pEVar81)) &&
                              ((((long)pEVar81 <= lVar27 && ((int)uStack_310 <= (int)uVar12)) &&
                               ((int)uVar12 <= (int)(uint)local_304)))) &&
                             (*(uint *)((long)&local_2d8->p + lVar32 * 4) == 1)))) ||
                           (((((lVar29 < lVar49 && (lVar53 <= (long)local_238)) &&
                              ((lVar66 < (long)pEVar81 &&
                               ((((long)puVar1 <= (long)local_2a8 &&
                                 ((int)uStack_310 <= (int)uVar12)) && ((int)uVar12 <= iVar21))))))
                             && (*(uint *)((long)&local_2a0->p + lVar32 * 4) == 1)) ||
                            (((lVar29 <= lVar49 && (lVar49 <= (long)local_238)) &&
                             ((((lVar66 < (long)pEVar81 &&
                                (((long)puVar1 <= (long)local_2a8 &&
                                 ((int)uStack_310 <= (int)uVar12)))) && ((int)uVar12 <= iVar21)) &&
                              (local_210[lVar32] == 1)))))))) ||
                          (((((lVar29 < lVar49 && (lVar53 <= (long)local_238)) &&
                             (lVar66 <= (long)pEVar81)) &&
                            (((long)pEVar81 <= (long)local_2a8 && ((int)uStack_310 <= (int)uVar12)))
                            ) && (((int)uVar12 <= iVar21 &&
                                  (*(uint *)((long)&local_1d0->p + lVar32 * 4) == 1))))))))
                      goto LAB_00563a18;
                      if ((((lVar49 < lVar29) || ((long)local_238 < lVar49)) ||
                          ((long)pEVar81 < lVar66)) ||
                         ((((long)local_2a8 < (long)pEVar81 || ((int)uVar12 < (int)uStack_310)) ||
                          (iVar21 < (int)uVar12)))) goto LAB_00563a25;
                      bVar72 = *(int *)((long)local_2e0 + lVar32 * 4) == 1;
                    }
                    else {
                      bVar72 = (~*(uint *)((long)&pEVar43[lVar32 - lVar63].flag + lVar33 + lVar42) &
                               3) == 0;
                      if (!bVar72 && local_188._0_1_ == '\0') goto LAB_00563734;
                    }
                    if (!bVar72) goto LAB_00563a25;
                  }
LAB_00563a18:
                  *(undefined8 *)(local_3f0 + lVar32 * 8) = 0;
                }
LAB_00563a25:
                lVar32 = lVar32 + 1;
              } while ((auStack_25c[0] - (uint)local_268) + 1 != (int)lVar32);
            }
            pEVar81 = (EBCellFlag *)((long)&pEVar81->flag + 1);
            local_3b8 = local_3b8 + 1;
            local_3f0 = local_3f0 + lVar71;
            local_198 = (EBCellFlag *)(ulong)uVar12;
          } while (auStack_25c[1] + 1 != (int)pEVar81);
        }
        local_158 = (double)CONCAT44(local_158._4_4_,local_158._0_4_ + 1);
        bVar72 = uVar12 != (uint)uStack_254;
        uVar12 = uVar12 + 1;
      } while (bVar72);
    }
  }
  local_268 = uVar16;
  free(local_1c0);
  return;
}

Assistant:

void build_cells (Box const& bx, Array4<EBCellFlag> const& cell,
                  Array4<Type_t> const& fx, Array4<Type_t> const& fy,
                  Array4<Type_t> const& fz, Array4<Real> const& apx,
                  Array4<Real> const& apy, Array4<Real> const& apz,
                  Array4<Real const> const& fcx, Array4<Real const> const& fcy,
                  Array4<Real const> const& fcz, Array4<Real const> const& m2x,
                  Array4<Real const> const& m2y, Array4<Real const> const& m2z,
                  Array4<Real> const& vfrac, Array4<Real> const& vcent,
                  Array4<Real> const& barea, Array4<Real> const& bcent,
                  Array4<Real> const& bnorm, Array4<EBCellFlag> const& ctmp,
                  Array4<Real> const& levset, Real small_volfrac, Geometry const& geom,
                  bool extend_domain_face, bool cover_multiple_cuts,
                  int& nsmallcells, int& nmulticuts) noexcept
{
    Gpu::Buffer<int> n_smallcell_multicuts = {0,0};
    int* hp = n_smallcell_multicuts.hostData();
    int* dp = n_smallcell_multicuts.data();

    const Box& bxg1 = amrex::grow(bx,1);
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bxg1, i, j, k,
    {
        bool is_small_cell = false;
        bool is_multicut = false;
        set_eb_cell(i, j, k, cell, apx, apy, apz, fcx, fcy, fcz, m2x, m2y, m2z,
                    vfrac, vcent, barea, bcent, bnorm, small_volfrac,
                    is_small_cell, is_multicut);
        if (is_small_cell) {
            Gpu::Atomic::Add(dp, 1);
        }
        if (is_multicut) {
            Gpu::Atomic::Add(dp+1, 1);
        }
    });

    // set cells in the extended region to covered if the
    // corresponding cell on the domain face is covered
    if(extend_domain_face) {

       Box gdomain = geom.Domain();
       for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (geom.isPeriodic(idim)) {
               gdomain.setSmall(idim, std::min(gdomain.smallEnd(idim), bxg1.smallEnd(idim)));
               gdomain.setBig(idim, std::max(gdomain.bigEnd(idim), bxg1.bigEnd(idim)));
           }
       }

       if (! gdomain.contains(bxg1)) {
          AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
          {
              const auto & dlo = gdomain.loVect();
              const auto & dhi = gdomain.hiVect();

              // find the cell(ii,jj,kk) on the corr. domain face
              // this would have already been set to correct value
              bool in_extended_domain = false;
              int ii = i;
              int jj = j;
              int kk = k;
              if(i < dlo[0]) {
                  in_extended_domain = true;
                  ii = dlo[0];
              }
              else if(i > dhi[0]) {
                  in_extended_domain = true;
                  ii = dhi[0];
              }

              if(j < dlo[1]) {
                  in_extended_domain = true;
                  jj = dlo[1];
              }
              else if(j > dhi[1]) {
                  in_extended_domain = true;
                  jj = dhi[1];
              }

              if(k < dlo[2]) {
                  in_extended_domain = true;
                  kk = dlo[2];
              }
              else if(k > dhi[2]) {
                  in_extended_domain = true;
                  kk = dhi[2];
              }

              // set cell in extendable region to covered if necessary
              if( in_extended_domain && (! cell(i,j,k).isCovered())
                  && cell(ii,jj,kk).isCovered() )
              {
                  Gpu::Atomic::Add(dp, 1);
                  set_covered(i,j,k,cell,vfrac,vcent,barea,bcent,bnorm);
              }
          });
       }
    }

    n_smallcell_multicuts.copyToHost();
    nsmallcells += hp[0];
    nmulticuts  += hp[1];

    if (nsmallcells > 0 || nmulticuts > 0) {
        if (!cover_multiple_cuts && nmulticuts > 0) {
            amrex::Abort("amrex::EB2::build_cells: multi-cuts not supported");
        }
        Box const& nbxg1 = amrex::surroundingNodes(bxg1);
        Box const& bxg1x = amrex::surroundingNodes(bxg1,0);
        Box const& bxg1y = amrex::surroundingNodes(bxg1,1);
        Box const& bxg1z = amrex::surroundingNodes(bxg1,2);
        AMREX_HOST_DEVICE_FOR_3D(nbxg1, i, j, k,
        {
            if (levset(i,j,k) < Real(0.0)) {
                bool zero_levset = false;
                if        (bxg1.contains(i-1,j-1,k-1)
                           &&       cell(i-1,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k-1)
                           &&       cell(i  ,j-1,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k-1)
                           &&       cell(i-1,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k-1)
                           &&       cell(i  ,j  ,k-1).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j-1,k  )
                           &&       cell(i-1,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j-1,k  )
                           &&       cell(i  ,j-1,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i-1,j  ,k  )
                           &&       cell(i-1,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (bxg1.contains(i  ,j  ,k  )
                           &&       cell(i  ,j  ,k  ).isCovered()) {
                    zero_levset = true;
                } else if (cover_multiple_cuts) {
                    if        (bxg1x.contains(i  ,j-1,k-1)
                               &&          fx(i  ,j-1,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k-1)
                               &&          fx(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j-1,k  )
                               &&          fx(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1x.contains(i  ,j  ,k  )
                               &&          fx(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k-1)
                               &&          fy(i-1,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k-1)
                               &&          fy(i  ,j  ,k-1) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i-1,j  ,k  )
                               &&          fy(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1y.contains(i  ,j  ,k  )
                               &&          fy(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j-1,k  )
                               &&          fz(i-1,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j-1,k  )
                               &&          fz(i  ,j-1,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i-1,j  ,k  )
                               &&          fz(i-1,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    } else if (bxg1z.contains(i  ,j  ,k  )
                               &&          fz(i  ,j  ,k  ) == Type::covered) {
                        zero_levset = true;
                    }
                }
                if (zero_levset) {
                    levset(i,j,k) = Real(0.0);
                }
            }
        });
        return;
    }

    // Build neighbors.  By default all 26 neighbors are already set.
    AMREX_HOST_DEVICE_FOR_3D ( bxg1, i, j, k,
    {
        if (cell(i,j,k).isCovered()) {
            cell(i,j,k).setDisconnected();
        } else {
            auto flg = cell(i,j,k);

            if (fx(i,j,k) == Type::covered) {
                flg.setDisconnected(-1,0,0);
            }
            if (fx(i+1,j,k) == Type::covered) {
                flg.setDisconnected(1,0,0);
            }
            if (fy(i,j,k) == Type::covered) {
                flg.setDisconnected(0,-1,0);
            }
            if (fy(i,j+1,k) == Type::covered) {
                flg.setDisconnected(0,1,0);
            }
            if (fz(i,j,k) == Type::covered) {
                flg.setDisconnected(0,0,-1);
            }
            if (fz(i,j,k+1) == Type::covered) {
                flg.setDisconnected(0,0,1);
            }

            // x-y
            if ((fx(i,j,k) == Type::covered || fy(i-1,j,k) == Type::covered) &&
                (fx(i,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,-1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j,k) == Type::covered) &&
                (fx(i+1,j-1,k) == Type::covered || fy(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,-1,0);
            }

            if ((fx(i,j,k) == Type::covered || fy(i-1,j+1,k) == Type::covered) &&
                (fx(i,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(-1,1,0);
            }

            if ((fx(i+1,j,k) == Type::covered || fy(i+1,j+1,k) == Type::covered) &&
                (fx(i+1,j+1,k) == Type::covered || fy(i,j+1,k) == Type::covered))
            {
                flg.setDisconnected(1,1,0);
            }

            // x-z
            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k) == Type::covered) &&
                (fx(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(-1,0,-1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k) == Type::covered) &&
                (fx(i+1,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(1,0,-1);
            }

            if ((fx(i,j,k) == Type::covered || fz(i-1,j,k+1) == Type::covered) &&
                (fx(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(-1,0,1);
            }

            if ((fx(i+1,j,k) == Type::covered || fz(i+1,j,k+1) == Type::covered) &&
                (fx(i+1,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(1,0,1);
            }

            // y-z
            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k) == Type::covered) &&
                (fy(i,j,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,-1,-1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k) == Type::covered) &&
                (fy(i,j+1,k-1) == Type::covered || fz(i,j,k) == Type::covered))
            {
                flg.setDisconnected(0,1,-1);
            }

            if ((fy(i,j,k) == Type::covered || fz(i,j-1,k+1) == Type::covered) &&
                (fy(i,j,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,-1,1);
            }

            if ((fy(i,j+1,k) == Type::covered || fz(i,j+1,k+1) == Type::covered) &&
                (fy(i,j+1,k+1) == Type::covered || fz(i,j,k+1) == Type::covered))
            {
                flg.setDisconnected(0,1,1);
            }

            cell(i,j,k) = flg;
        }

        ctmp(i,j,k) = cell(i,j,k);
    });

    AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
    {
        if (!cell(i,j,k).isCovered()) {
            auto tmpflg = ctmp(i,j,k);
            auto newflg = tmpflg;

            // -1, -1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1,-1);
            }

            // 1, -1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1,-1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1,-1);
            }

            // -1, 1, -1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1, 1,-1);
            }

            // 1, 1, -1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1,-1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0,-1)) &&
                (tmpflg.isDisconnected( 0, 0,-1) || ctmp(i  ,j  ,k-1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1, 1,-1);
            }

            // -1, -1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1,-1, 0)))
            {
                newflg.setDisconnected(-1,-1, 1);
            }

            // 1, -1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0,-1, 1)) &&
                (tmpflg.isDisconnected( 0,-1, 0) || ctmp(i  ,j-1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1,-1, 0)))
            {
                newflg.setDisconnected(1,-1, 1);
            }

            // -1, 1, 1 corner
            if ((tmpflg.isDisconnected(-1, 0, 0) || ctmp(i-1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected(-1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected(-1, 1, 0)))
            {
                newflg.setDisconnected(-1,1,1);
            }

            // 1, 1, 1 corner
            if ((tmpflg.isDisconnected( 1, 0, 0) || ctmp(i+1,j  ,k  ).isDisconnected( 0, 1, 1)) &&
                (tmpflg.isDisconnected( 0, 1, 0) || ctmp(i  ,j+1,k  ).isDisconnected( 1, 0, 1)) &&
                (tmpflg.isDisconnected( 0, 0, 1) || ctmp(i  ,j  ,k+1).isDisconnected( 1, 1, 0)))
            {
                newflg.setDisconnected(1,1,1);
            }

            cell(i,j,k) = newflg;
        }
    });
}